

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__get16be(stbi__context *s)

{
  stbi_uc *psVar1;
  int iVar2;
  uint uVar3;
  byte *pbVar4;
  uint uVar5;
  
  pbVar4 = s->img_buffer;
  if (pbVar4 < s->img_buffer_end) {
LAB_0012531d:
    s->img_buffer = pbVar4 + 1;
    uVar5 = (uint)*pbVar4 << 8;
  }
  else {
    if (s->read_from_callbacks != 0) {
      psVar1 = s->buffer_start;
      iVar2 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
      if (iVar2 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar1;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar1;
        s->img_buffer_end = psVar1 + iVar2;
      }
      pbVar4 = s->img_buffer;
      goto LAB_0012531d;
    }
    uVar5 = 0;
  }
  pbVar4 = s->img_buffer;
  if (s->img_buffer_end <= pbVar4) {
    if (s->read_from_callbacks == 0) {
      uVar3 = 0;
      goto LAB_001253a4;
    }
    psVar1 = s->buffer_start;
    iVar2 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
    if (iVar2 == 0) {
      s->read_from_callbacks = 0;
      s->img_buffer = psVar1;
      s->img_buffer_end = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
    }
    else {
      s->img_buffer = psVar1;
      s->img_buffer_end = psVar1 + iVar2;
    }
    pbVar4 = s->img_buffer;
  }
  s->img_buffer = pbVar4 + 1;
  uVar3 = (uint)*pbVar4;
LAB_001253a4:
  return uVar5 | uVar3;
}

Assistant:

static int stbi__get16be(stbi__context *s)
{
   int z = stbi__get8(s);
   return (z << 8) + stbi__get8(s);
}